

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_value.h
# Opt level: O2

indirect_value<int,_stats,_stats> * __thiscall
isocpp_p1950::indirect_value<int,_stats,_stats>::operator=
          (indirect_value<int,_stats,_stats> *this,indirect_value<int,_stats,_stats> *i)

{
  int *piVar1;
  pointer __p;
  unique_ptr<int,_std::reference_wrapper<const_stats>_> local_30;
  
  piVar1 = make_raw_copy(i);
  local_30._M_t.super___uniq_ptr_impl<int,_std::reference_wrapper<const_stats>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::reference_wrapper<const_stats>_>.
  super__Tuple_impl<1UL,_std::reference_wrapper<const_stats>_>.
  super__Head_base<1UL,_std::reference_wrapper<const_stats>,_false>._M_head_impl._M_data =
       (_Head_base<1UL,_std::reference_wrapper<const_stats>,_false>)((long)&i->ptr_ + 1);
  reset(this);
  stats::copy_assign_count = stats::copy_assign_count + 2;
  local_30._M_t.super___uniq_ptr_impl<int,_std::reference_wrapper<const_stats>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::reference_wrapper<const_stats>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
  this->ptr_ = piVar1;
  std::unique_ptr<int,_std::reference_wrapper<const_stats>_>::~unique_ptr(&local_30);
  return this;
}

Assistant:

constexpr indirect_value& operator=(const indirect_value& i) {
    // When copying T throws, *this will remain unchanged.
    // When assigning copy_base or delete_base throws,
    // ptr_ will be null.
    auto temp_guard = i.make_guarded_copy();
    reset();
    copy_base::operator=(i);
    delete_base::operator=(i);
    ptr_ = temp_guard.release();
    return *this;
  }